

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

tuple<unsigned_long,_unsigned_long,_unsigned_long> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::find_adjacent_children
          (tuple<unsigned_long,_unsigned_long,_unsigned_long> *__return_storage_ptr__,
          bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_const_ref t,size_t child)

{
  ulong k;
  size_t sVar1;
  ulong uVar2;
  word_type wVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t k_00;
  unsigned_long uVar12;
  ulong uVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  ulong local_a8;
  subtree_ref_base<true> local_68;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *local_40;
  long local_38;
  
  local_40 = __return_storage_ptr__;
  subtree_ref_base<true>::child(&local_68,&t,child);
  uVar11 = this->buffer;
  uVar2 = this->degree + 1;
  uVar13 = uVar2;
  if (local_68._height == 0) {
    uVar13 = 0x1000;
  }
  uVar10 = 0;
  uVar5 = (child - uVar11) + 1;
  if (child < uVar11) {
    uVar5 = uVar10;
  }
  uVar8 = uVar11 + uVar5;
  if (uVar2 < uVar11 + uVar5) {
    uVar8 = uVar2;
  }
  if (uVar5 < uVar8) {
    uVar10 = 0;
    uVar11 = uVar5;
    do {
      sVar1 = ((t._vector)->pointers)._width;
      lVar6 = ((t._vector)->degree + 1) * t._index;
      wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&((t._vector)->pointers)._bits,(uVar11 + lVar6) * sVar1,
                  (uVar11 + 1 + lVar6) * sVar1);
      uVar2 = uVar13;
      if (wVar3 != 0) {
        if (local_68._height == 0) {
          subtree_ref_base<true>::child(&local_68,&t,uVar11);
          uVar2 = 0x1000 - local_68._size;
        }
        else {
          sVar1 = this->degree;
          subtree_ref_base<true>::child(&local_68,&t,uVar11);
          if (local_68._size == 0) {
            uVar2 = 0;
          }
          else {
            pVar14 = subtree_ref_base<true>::find_insert_point(&local_68,local_68._size);
            uVar2 = ~pVar14.first;
          }
          uVar2 = sVar1 + 1 + uVar2;
        }
      }
      uVar10 = uVar10 + uVar2;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  local_38 = uVar5 - child;
  uVar9 = uVar5;
  uVar11 = uVar10;
  uVar12 = uVar8;
  if (uVar5 < child) {
    lVar6 = 0;
    uVar2 = uVar10;
    do {
      if (t._size == 0) {
        uVar4 = 0;
      }
      else {
        pVar14 = subtree_ref_base<true>::find_insert_point(&t,t._size);
        uVar4 = pVar14.first + 1;
      }
      k = uVar8 + lVar6;
      uVar11 = uVar2;
      if (uVar4 <= k) break;
      k_00 = uVar5 + lVar6;
      sVar1 = ((t._vector)->pointers)._width;
      lVar7 = ((t._vector)->degree + 1) * t._index;
      wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&((t._vector)->pointers)._bits,(k_00 + lVar7) * sVar1,(lVar7 + 1 + k_00) * sVar1);
      local_a8 = uVar13;
      if (wVar3 != 0) {
        if (local_68._height == 0) {
          subtree_ref_base<true>::child(&local_68,&t,k_00);
          local_a8 = 0x1000 - local_68._size;
        }
        else {
          sVar1 = this->degree;
          subtree_ref_base<true>::child(&local_68,&t,k_00);
          if (local_68._size == 0) {
            local_a8 = 0;
          }
          else {
            pVar14 = subtree_ref_base<true>::find_insert_point(&local_68,local_68._size);
            local_a8 = ~pVar14.first;
          }
          local_a8 = sVar1 + 1 + local_a8;
        }
      }
      sVar1 = ((t._vector)->pointers)._width;
      lVar7 = ((t._vector)->degree + 1) * t._index;
      wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&((t._vector)->pointers)._bits,(k + lVar7) * sVar1,(lVar7 + 1 + k) * sVar1);
      uVar4 = uVar13;
      if (wVar3 != 0) {
        if (local_68._height == 0) {
          subtree_ref_base<true>::child(&local_68,&t,k);
          uVar4 = 0x1000 - local_68._size;
        }
        else {
          sVar1 = this->degree;
          subtree_ref_base<true>::child(&local_68,&t,k);
          if (local_68._size == 0) {
            uVar4 = 0;
          }
          else {
            pVar14 = subtree_ref_base<true>::find_insert_point(&local_68,local_68._size);
            uVar4 = ~pVar14.first;
          }
          uVar4 = sVar1 + 1 + uVar4;
        }
      }
      uVar10 = (uVar10 - local_a8) + uVar4;
      if (uVar2 < uVar10) {
        uVar11 = uVar10;
        uVar12 = lVar6 + 1 + uVar8;
      }
      if (uVar2 < uVar10) {
        uVar9 = lVar6 + 1 + uVar5;
      }
      lVar6 = lVar6 + 1;
      uVar2 = uVar11;
    } while (local_38 + lVar6 != 0);
  }
  (local_40->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<2UL,_unsigned_long>.
  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl = uVar13 * this->buffer - uVar11;
  (local_40->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar12;
  (local_40->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar9;
  return local_40;
}

Assistant:

std::tuple<size_t, size_t, size_t>
        bt_impl<W, AP>::find_adjacent_children(subtree_const_ref t,
                                               size_t child)
        {
            const bool is_leaf = t.child(child).is_leaf();
            const size_t max_count = is_leaf ? leaf_bits : (degree + 1);
            const auto count = [&](size_t i) {
                return t.pointers(i) == 0 ? max_count :
                       is_leaf            ? leaf_bits - t.child(i).size() :
                                            (degree + 1) - t.child(i).nchildren();
            };
            
            size_t begin = child >= buffer ? child - buffer + 1 : 0;
            size_t end = min(begin + buffer, degree + 1);
            
            size_t freeslots = 0;
            size_t maxfreeslots = 0;
            std::pair<size_t, size_t> window = { begin, end };
            
            // Sum for the initial window
            for(size_t i = begin; i < end; ++i)
                freeslots += count(i);
            maxfreeslots = freeslots;
            
            // Slide the window
            while(begin < child && end < t.nchildren())
            {
                freeslots = freeslots - count(begin) + count(end);
                
                begin += 1;
                end += 1;
                
                if(freeslots > maxfreeslots) {
                    window = { begin, end };
                    maxfreeslots = freeslots;
                }
            }
            
            // Reverse the count of free slots to get the total number of bits
            size_t total = max_count * buffer - maxfreeslots;
            
            assert(window.first <= child && child < window.second);
            return std::make_tuple( window.first, window.second, total );
        }